

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void lore_append_abilities(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  bitflag *flags;
  undefined8 uVar1;
  long lVar2;
  _Bool _Var3;
  _Bool _Var4;
  monster_sex_t mVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t flag;
  char *__s2;
  undefined8 uVar8;
  byte bVar9;
  char *pcVar10;
  bitflag current_flags [12];
  bitflag test_flags [12];
  char start [40];
  bitflag local_84 [12];
  long local_78;
  monster_lore *local_70;
  bitflag local_64 [12];
  char local_58 [40];
  
  local_70 = lore;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x50b,
                  "void lore_append_abilities(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  mVar5 = lore_monster_sex(race);
  local_78 = (ulong)mVar5 * 0x10;
  uVar1 = *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + local_78 + 8);
  create_mon_flag_mask(local_84,8,0xf);
  flag_inter(local_84,known_flags,0xc);
  strnfmt(local_58,0x28,"%s can ",uVar1);
  lore_append_clause(tb,local_84,'\x01',local_58,"and",".  ");
  create_mon_flag_mask(local_84,7,0xf);
  flag_inter(local_84,known_flags,0xc);
  strnfmt(local_58,0x28,"%s is ",uVar1);
  lore_append_clause(tb,local_84,'\x01',local_58,"and",".  ");
  _Var3 = flag_has_dbg(known_flags,0xc,0x16,"known_flags","RF_UNAWARE");
  if (_Var3) {
    textblock_append(tb,"%s disguises itself as something else.  ",uVar1);
  }
  _Var3 = flag_has_dbg(known_flags,0xc,0x17,"known_flags","RF_MULTIPLY");
  if (_Var3) {
    textblock_append_c(tb,'\x03',"%s breeds explosively.  ",uVar1);
  }
  _Var3 = flag_has_dbg(known_flags,0xc,0x18,"known_flags","RF_REGENERATE");
  lVar2 = local_78;
  if (_Var3) {
    textblock_append(tb,"%s regenerates quickly.  ",uVar1);
  }
  _Var3 = flag_has_dbg(known_flags,0xc,0x22,"known_flags","RF_FLYING");
  if (_Var3) {
    textblock_append(tb,"%s can fly.  ",uVar1);
  }
  _Var3 = flag_has_dbg(known_flags,0xc,0x25,"known_flags","RF_TERRITORIAL");
  if (_Var3) {
    textblock_append(tb,"%s is more aggressive in %s own territory.  ",uVar1,
                     *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar2));
  }
  wVar7 = race->light;
  if (wVar7 < L'\x02') {
    if (wVar7 == L'\xffffffff') {
      pcVar10 = "%s is darkened.  ";
    }
    else {
      if (wVar7 != L'\x01') {
        if (L'\xfffffffe' < wVar7) goto LAB_00178d94;
        uVar8 = *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar2);
        pcVar10 = "%s shrouds %s surroundings in darkness.  ";
        goto LAB_00178d5a;
      }
      pcVar10 = "%s is illuminated.  ";
    }
    textblock_append(tb,pcVar10,uVar1);
  }
  else {
    uVar8 = *(undefined8 *)(lore_pronoun_possessive_lore_pronouns + lVar2);
    pcVar10 = "%s illuminates %s surroundings.  ";
LAB_00178d5a:
    textblock_append(tb,pcVar10,uVar1,uVar8);
  }
LAB_00178d94:
  create_mon_flag_mask(local_84,0xb,0xc,0xf);
  flag_inter(local_84,known_flags,0xc);
  strnfmt(local_58,0x28,"%s is hurt by ",uVar1);
  lore_append_clause(tb,local_84,'\x11',local_58,"and","");
  _Var3 = flag_is_empty(local_84,0xc);
  local_78 = CONCAT71(local_78._1_7_,_Var3);
  create_mon_flag_mask(local_84,0xd,0xf);
  flag_inter(local_84,known_flags,0xc);
  create_mon_flag_mask(local_64,0xb,0xf);
  iVar6 = flag_next(local_64,0xc,1);
  if (iVar6 != 0) {
    flags = local_70->flags;
    do {
      _Var3 = flag_has_dbg(flags,0xc,iVar6,"lore->flags","flag");
      if ((_Var3) && (_Var3 = flag_has_dbg(known_flags,0xc,iVar6,"known_flags","flag"), !_Var3)) {
        flag_on_dbg(local_84,0xc,iVar6,"current_flags","flag");
      }
      iVar6 = flag_next(local_64,0xc,iVar6 + 1);
    } while (iVar6 != 0);
  }
  if ((byte)local_78 == '\0') {
    my_strcpy(local_58,", but resists ",0x28);
  }
  else {
    strnfmt(local_58,0x28,"%s resists ",uVar1);
  }
  lore_append_clause(tb,local_84,'\x0f',local_58,"and","");
  _Var3 = flag_is_empty(local_84,0xc);
  flag_wipe(local_84,0xc);
  create_mon_flag_mask(local_64,0xd,0xf);
  iVar6 = flag_next(local_64,0xc,1);
  if (iVar6 != 0) {
    local_70 = (monster_lore *)local_70->flags;
    do {
      _Var4 = flag_has_dbg((bitflag *)local_70,0xc,iVar6,"lore->flags","flag");
      if ((_Var4) && (_Var4 = flag_has_dbg(known_flags,0xc,iVar6,"known_flags","flag"), !_Var4)) {
        flag_on_dbg(local_84,0xc,iVar6,"current_flags","flag");
      }
      iVar6 = flag_next(local_64,0xc,iVar6 + 1);
    } while (iVar6 != 0);
  }
  bVar9 = _Var3 & (byte)local_78;
  create_mon_flag_mask(local_64,0xc,0xf);
  flag_inter(local_64,known_flags,0xc);
  wVar7 = flag_next(local_64,0xc,1);
  if (wVar7 != L'\0') {
    do {
      for (flag = flag_next(local_84,0xc,1); flag != L'\0';
          flag = flag_next(local_84,0xc,flag + L'\x01')) {
        pcVar10 = describe_race_flag(wVar7);
        __s2 = describe_race_flag(flag);
        iVar6 = strcmp(pcVar10,__s2);
        if (iVar6 == 0) {
          flag_off(local_84,0xc,flag);
        }
      }
      wVar7 = flag_next(local_64,0xc,wVar7 + L'\x01');
    } while (wVar7 != L'\0');
  }
  if (bVar9 == 0) {
    my_strcpy(local_58,", and does not resist ",0x28);
  }
  else {
    strnfmt(local_58,0x28,"%s does not resist ",uVar1);
  }
  _Var3 = flag_has_dbg(known_flags,0xc,0x49,"known_flags","RF_UNDEAD");
  if (_Var3) {
    flag_off(local_84,0xc,0x55);
  }
  lore_append_clause(tb,local_84,'\x0f',local_58,"or","");
  _Var3 = flag_is_empty(local_84,0xc);
  bVar9 = _Var3 & bVar9;
  create_mon_flag_mask(local_84,0xe,0xf);
  flag_inter(local_84,known_flags,0xc);
  if (bVar9 == 0) {
    my_strcpy(local_58,", and cannot be ",0x28);
  }
  else {
    strnfmt(local_58,0x28,"%s cannot be ",uVar1);
  }
  lore_append_clause(tb,local_84,'\x0f',local_58,"or","");
  _Var3 = flag_is_empty(local_84,0xc);
  if ((_Var3 & bVar9) == 0) {
    textblock_append(tb,".  ");
  }
  return;
}

Assistant:

void lore_append_abilities(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	int flag;
	char start[40];
	const char *initial_pronoun;
	bool prev = false;
	bitflag current_flags[RF_SIZE], test_flags[RF_SIZE];
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Describe environment-shaping abilities. */
	create_mon_flag_mask(current_flags, RFT_ALTER, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s can ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe detection traits */
	create_mon_flag_mask(current_flags, RFT_DET, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_WHITE, start, "and", ".  ");

	/* Describe special things */
	if (rf_has(known_flags, RF_UNAWARE))
		textblock_append(tb, "%s disguises itself as something else.  ",
						 initial_pronoun);
	if (rf_has(known_flags, RF_MULTIPLY))
		textblock_append_c(tb, COLOUR_ORANGE, "%s breeds explosively.  ",
						   initial_pronoun);
	if (rf_has(known_flags, RF_REGENERATE))
		textblock_append(tb, "%s regenerates quickly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_FLYING))
		textblock_append(tb, "%s can fly.  ", initial_pronoun);
	if (rf_has(known_flags, RF_TERRITORIAL))
		textblock_append(tb, "%s is more aggressive in %s own territory.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));

	/* Describe light */
	if (race->light > 1) {
		textblock_append(tb, "%s illuminates %s surroundings.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	} else if (race->light == 1) {
		textblock_append(tb, "%s is illuminated.  ", initial_pronoun);
	} else if (race->light == -1) {
		textblock_append(tb, "%s is darkened.  ", initial_pronoun);
	} else if (race->light < -1) {
		textblock_append(tb, "%s shrouds %s surroundings in darkness.  ",
						 initial_pronoun, lore_pronoun_possessive(msex, false));
	}

	/* Collect susceptibilities */
	create_mon_flag_mask(current_flags, RFT_VULN, RFT_VULN_I, RFT_MAX);
	rf_inter(current_flags, known_flags);
	strnfmt(start, sizeof(start), "%s is hurt by ", initial_pronoun);
	lore_append_clause(tb, current_flags, COLOUR_VIOLET, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect immunities and resistances */
	create_mon_flag_mask(current_flags, RFT_RES, RFT_MAX);
	rf_inter(current_flags, known_flags);

	/* Note lack of vulnerability as a resistance */
	create_mon_flag_mask(test_flags, RFT_VULN, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", but resists ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s resists ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "and", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect known but average susceptibilities */
	rf_wipe(current_flags);
	create_mon_flag_mask(test_flags, RFT_RES, RFT_MAX);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		if (rf_has(lore->flags, flag) && !rf_has(known_flags, flag)) {
			rf_on(current_flags, flag);
		}
	}

	/* Vulnerabilities need to be specifically removed */
	create_mon_flag_mask(test_flags, RFT_VULN_I, RFT_MAX);
	rf_inter(test_flags, known_flags);
	for (flag = rf_next(test_flags, FLAG_START); flag;
		 flag = rf_next(test_flags, flag + 1)) {
		int susc_flag;
		for (susc_flag = rf_next(current_flags, FLAG_START); susc_flag;
			 susc_flag = rf_next(current_flags, susc_flag + 1)) {
			if (streq(describe_race_flag(flag), describe_race_flag(susc_flag)))
				rf_off(current_flags, susc_flag);
		}
	}
	if (prev) {
		my_strcpy(start, ", and does not resist ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s does not resist ",
			initial_pronoun);
	}

	/* Special case for undead */
	if (rf_has(known_flags, RF_UNDEAD)) {
		rf_off(current_flags, RF_IM_NETHER);
	}

	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	/* Collect non-effects */
	create_mon_flag_mask(current_flags, RFT_PROT, RFT_MAX);
	rf_inter(current_flags, known_flags);
	if (prev) {
		my_strcpy(start, ", and cannot be ", sizeof(start));
	} else {
		strnfmt(start, sizeof(start), "%s cannot be ", initial_pronoun);
	}
	lore_append_clause(tb, current_flags, COLOUR_L_UMBER, start, "or", "");
	if (!rf_is_empty(current_flags)) {
		prev = true;
	}

	if (prev)
		textblock_append(tb, ".  ");
}